

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteObject(ON_BinaryArchive *this,ON_Object *model_object)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_NurbsCurve *pOVar4;
  ON_NurbsSurface *pOVar5;
  ON_TextDot *this_00;
  wchar_t *s;
  ON_Annotation *V6_annotation;
  ON_Extrusion *this_01;
  undefined4 extraout_var;
  ON_SumSurface *model_object_00;
  ON_OBSOLETE_V5_Annotation *V5_annotation;
  ON_NurbsCurve nurbs_curve;
  
  if (this->m_3dm_version - 1U < 0x32) {
    iVar2 = (*model_object->_vptr_ON_Object[0xc])(model_object);
    if (iVar2 != 0x40000000) {
      if (iVar2 == 8) {
        if ((this->m_3dm_version < 3) &&
           (pOVar5 = ON_NurbsSurface::Cast(model_object), pOVar5 == (ON_NurbsSurface *)0x0)) {
          ON_NurbsSurface::ON_NurbsSurface((ON_NurbsSurface *)&nurbs_curve);
          iVar2 = (*model_object->_vptr_ON_Object[0x3c])(0,model_object);
          if ((iVar2 != 0) &&
             ((iVar2 = ON_NurbsSurface::Order((ON_NurbsSurface *)&nurbs_curve,0), 1 < iVar2 &&
              (iVar2 = ON_NurbsSurface::Order((ON_NurbsSurface *)&nurbs_curve,1), 1 < iVar2)))) {
            iVar2 = ON_NurbsSurface::CVCount((ON_NurbsSurface *)&nurbs_curve,0);
            iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)&nurbs_curve,0);
            if (iVar3 <= iVar2) {
              iVar2 = ON_NurbsSurface::CVCount((ON_NurbsSurface *)&nurbs_curve,1);
              iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)&nurbs_curve,1);
              if ((iVar3 <= iVar2) &&
                 (iVar2 = ON_NurbsSurface::Dimension((ON_NurbsSurface *)&nurbs_curve), 0 < iVar2)) {
                bVar1 = Internal_WriteObject(this,(ON_Object *)&nurbs_curve);
                ON_NurbsSurface::~ON_NurbsSurface((ON_NurbsSurface *)&nurbs_curve);
                return bVar1;
              }
            }
          }
          ON_NurbsSurface::~ON_NurbsSurface((ON_NurbsSurface *)&nurbs_curve);
        }
      }
      else if (iVar2 == 0x200) {
        V6_annotation = ON_Annotation::Cast(model_object);
        if (V6_annotation != (ON_Annotation *)0x0) {
          bVar1 = Internal_WriteV5AnnotationObject
                            (this,V6_annotation,(ON_3dmAnnotationContext *)0x0);
          return bVar1;
        }
        if ((this->m_3dm_version < 3) &&
           (V5_annotation = ON_OBSOLETE_V5_Annotation::Cast(model_object),
           V5_annotation != (ON_OBSOLETE_V5_Annotation *)0x0)) {
          bVar1 = Internal_WriteV2AnnotationObject
                            (this,V5_annotation,(ON_3dmAnnotationContext *)0x0);
          return bVar1;
        }
      }
      else if (iVar2 == 0x2000) {
        if ((this->m_3dm_version < 3) &&
           (this_00 = ON_TextDot::Cast(model_object), this_00 != (ON_TextDot *)0x0)) {
          ON_OBSOLETE_V2_TextDot::ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)&nurbs_curve);
          ON_TextDot::CenterPoint(this_00);
          s = ON_TextDot::PrimaryText(this_00);
          ON_wString::operator=((ON_wString *)&nurbs_curve.m_knot,s);
          bVar1 = Internal_WriteObject(this,(ON_Object *)&nurbs_curve);
          ON_OBSOLETE_V2_TextDot::~ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)&nurbs_curve);
          return bVar1;
        }
      }
      else if (((iVar2 == 4) && (this->m_3dm_version < 3)) &&
              (pOVar4 = ON_NurbsCurve::Cast(model_object), pOVar4 == (ON_NurbsCurve *)0x0)) {
        ON_NurbsCurve::ON_NurbsCurve(&nurbs_curve);
        iVar2 = (*model_object->_vptr_ON_Object[0x3f])(0,model_object,&nurbs_curve,0);
        if ((iVar2 != 0) && (iVar2 = ON_NurbsCurve::Order(&nurbs_curve), 1 < iVar2)) {
          iVar2 = ON_NurbsCurve::CVCount(&nurbs_curve);
          iVar3 = ON_NurbsCurve::Order(&nurbs_curve);
          if ((iVar3 <= iVar2) && (iVar2 = ON_NurbsCurve::Dimension(&nurbs_curve), 0 < iVar2)) {
            bVar1 = Internal_WriteObject(this,(ON_Object *)&nurbs_curve);
            ON_NurbsCurve::~ON_NurbsCurve(&nurbs_curve);
            return bVar1;
          }
        }
        ON_NurbsCurve::~ON_NurbsCurve(&nurbs_curve);
      }
      goto LAB_003c5a9f;
    }
    if ((4 < this->m_3dm_version) ||
       (this_01 = ON_Extrusion::Cast(model_object), this_01 == (ON_Extrusion *)0x0))
    goto LAB_003c5a9f;
    iVar2 = ON_Extrusion::IsCapped(this_01);
    if ((iVar2 != 0) || (iVar2 = ON_Extrusion::ProfileCount(this_01), 1 < iVar2)) {
      iVar2 = (*(this_01->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x21])
                        (this_01);
      model_object_00 = (ON_SumSurface *)CONCAT44(extraout_var,iVar2);
      if (model_object_00 != (ON_SumSurface *)0x0) goto LAB_003c5a45;
    }
    if (((3 < this->m_3dm_version) &&
        (model_object_00 = ON_Extrusion::SumSurfaceForm(this_01,(ON_SumSurface *)0x0),
        model_object_00 != (ON_SumSurface *)0x0)) ||
       (model_object_00 =
             (ON_SumSurface *)
             ON_Surface::NurbsSurface
                       (&this_01->super_ON_Surface,(ON_NurbsSurface *)0x0,0.0,(ON_Interval *)0x0,
                        (ON_Interval *)0x0), model_object_00 != (ON_SumSurface *)0x0)) {
LAB_003c5a45:
      bVar1 = Internal_WriteObject(this,(ON_Object *)model_object_00);
      (*(model_object_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                (model_object_00);
      return bVar1;
    }
  }
LAB_003c5a9f:
  bVar1 = Internal_WriteObject(this,model_object);
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::WriteObject( const ON_Object& model_object )
{
  // writes polymorphic object derived from ON_Object in a way that
  // it can be recreated from ON_BinaryArchive::ReadObject

  if ( m_3dm_version >= 1 && m_3dm_version <= 50 )
  {
    const ON::object_type model_object_type = model_object.ObjectType();
    switch (model_object_type)
    {
    case ON::object_type::curve_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Curve* curve = static_cast<const ON_Curve*>(&model_object);
        if (nullptr == curve)
          break;
        if (nullptr != ON_NurbsCurve::Cast(curve))
          break;
        ON_NurbsCurve nurbs_curve;
        if (curve->GetNurbForm(nurbs_curve)
          && nurbs_curve.Order() >= 2
          && nurbs_curve.CVCount() >= nurbs_curve.Order()
          && nurbs_curve.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_curve);
        }
      }
      break;

    case ON::object_type::surface_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Surface* surface = static_cast<const ON_Surface*>(&model_object);
        if (nullptr == surface)
          break;
        if (nullptr != ON_NurbsSurface::Cast(surface))
          break;
        ON_NurbsSurface nurbs_surface;
        if (surface->GetNurbForm(nurbs_surface)
          && nurbs_surface.Order(0) >= 2
          && nurbs_surface.Order(1) >= 2
          && nurbs_surface.CVCount(0) >= nurbs_surface.Order(0)
          && nurbs_surface.CVCount(1) >= nurbs_surface.Order(1)
          && nurbs_surface.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_surface);
        }
      }
      break;

    case ON::extrusion_object:
      {
        if (m_3dm_version > 4)
          break;
        // 29 September 2010 Dale Lear
        //   ON_Extrusion was added in V5.  It must be translated
        //   to a brep or surface to save it in a V4 file.
        const ON_Extrusion* extrusion = ON_Extrusion::Cast(&model_object);
        if (nullptr == extrusion)
          break;
        ON_Object* V4_object = nullptr;
        if (extrusion->IsCapped() || extrusion->ProfileCount() >= 2)
          V4_object = extrusion->BrepForm(0);
        if (nullptr == V4_object)
        {
          if (m_3dm_version >= 4)
            V4_object = extrusion->SumSurfaceForm(0);
          if (nullptr == V4_object)
            V4_object = extrusion->NurbsSurface(0);
          if (nullptr == V4_object)
            break;
        }
        const bool rc = Internal_WriteObject(*V4_object);
        delete V4_object;
        return rc;
      }
      break;

    case ON::annotation_object:
      {
        const ON_Annotation* V6_annotation = ON_Annotation::Cast(&model_object);
        if (nullptr != V6_annotation)
          return Internal_WriteV5AnnotationObject(*V6_annotation, nullptr);
        if (m_3dm_version > 2)
          break;

        const ON_OBSOLETE_V5_Annotation* V5_annotation = ON_OBSOLETE_V5_Annotation::Cast(&model_object);
        if (nullptr != V5_annotation)
          return Internal_WriteV2AnnotationObject(*V5_annotation, nullptr);
      }
      break;

    case ON::object_type::text_dot:
      {
        if (m_3dm_version > 2)
          break;
        const ON_TextDot* text_dot = ON_TextDot::Cast(&model_object);
        if (nullptr == text_dot)
          break;
        ON_OBSOLETE_V2_TextDot V2_text_dot;
        V2_text_dot.point = text_dot->CenterPoint();
        V2_text_dot.m_text = text_dot->PrimaryText();
        return Internal_WriteObject(V2_text_dot);
      }
      break;
    default:
      break;
    }
  }
  
  return Internal_WriteObject(model_object);
}